

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::initPrograms
          (TextureGatherCubeCase *this,SourceCollections *dst)

{
  GatherType gatherType;
  pointer programCollection;
  allocator<vkt::sr::(anonymous_namespace)::GatherArgs> local_61;
  __normal_iterator<const_vkt::sr::(anonymous_namespace)::GatherCubeArgs_*,_std::vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>_>
  local_60;
  __normal_iterator<const_vkt::sr::(anonymous_namespace)::GatherCubeArgs_*,_std::vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>_>
  local_58;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_50;
  Vector<int,_2> local_38;
  undefined1 local_30 [8];
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  SourceCollections *dst_local;
  TextureGatherCubeCase *this_local;
  
  gatherType = (this->m_baseParams).gatherType;
  iterations.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)dst;
  if ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    tcu::Vector<int,_2>::Vector(&local_38,0);
  }
  else {
    getOffsetRange((anon_unknown_0 *)&local_38,(this->m_baseParams).offsetSize);
  }
  generateCubeCaseIterations
            ((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              *)local_30,gatherType,&(this->m_baseParams).textureFormat,&local_38);
  programCollection =
       iterations.
       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_current =
       (GatherCubeArgs *)
       std::
       vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
       ::begin((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                *)local_30);
  local_60._M_current =
       (GatherCubeArgs *)
       std::
       vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
       ::end((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              *)local_30);
  std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>::allocator(&local_61);
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>>
  ::
  vector<__gnu_cxx::__normal_iterator<vkt::sr::(anonymous_namespace)::GatherCubeArgs_const*,std::vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>>>,void>
            ((vector<vkt::sr::(anonymous_namespace)::GatherArgs,std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>>
              *)&local_50,local_58,local_60,&local_61);
  genGatherPrograms((SourceCollections *)programCollection,&this->m_baseParams,&local_50);
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ::~vector(&local_50);
  std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>::~allocator(&local_61);
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::~vector((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *)local_30);
  return;
}

Assistant:

void TextureGatherCubeCase::initPrograms (vk::SourceCollections& dst) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 m_baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(m_baseParams.offsetSize) : IVec2(0));

	genGatherPrograms(dst, m_baseParams, vector<GatherArgs>(iterations.begin(), iterations.end()));
}